

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

bool __thiscall
Js::JavascriptRegExp::GetPropertyBuiltIns
          (JavascriptRegExp *this,PropertyId propertyId,Var *value,BOOL *result)

{
  JavascriptLibrary *this_00;
  code *pcVar1;
  bool bVar2;
  JavascriptString *pJVar3;
  undefined4 *puVar4;
  Var ptr;
  ScriptContext *scriptContext;
  uint nValue;
  
  this_00 = (((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
  scriptContext = (this_00->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar2 = false;
  switch(propertyId) {
  case 0x1a0:
    if (((scriptContext->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar2 = UnifiedRegex::RegexPattern::IsGlobal((this->pattern).ptr);
    break;
  case 0x1a1:
    goto switchD_00bb2fdf_caseD_1a1;
  case 0x1a2:
    pJVar3 = (JavascriptString *)(this->lastIndexVar).ptr;
    if (pJVar3 == (JavascriptString *)0x0) {
      nValue = this->lastIndexOrFlag;
      if (0x7ffffffe < nValue) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                    ,0x4ae,"(lastIndexOrFlag <= MaxCharCount)",
                                    "lastIndexOrFlag <= MaxCharCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        nValue = this->lastIndexOrFlag;
        scriptContext =
             (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      }
      ptr = JavascriptNumber::ToVar(nValue,scriptContext);
      Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->lastIndexVar,ptr);
      pJVar3 = (JavascriptString *)(this->lastIndexVar).ptr;
    }
    goto LAB_00bb315d;
  case 0x1a3:
    if (((scriptContext->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar2 = UnifiedRegex::RegexPattern::IsMultiline((this->pattern).ptr);
    break;
  case 0x1a4:
    if (((scriptContext->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar2 = UnifiedRegex::RegexPattern::IsDotAll((this->pattern).ptr);
    break;
  case 0x1a5:
    if (((scriptContext->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar2 = UnifiedRegex::RegexPattern::IsIgnoreCase((this->pattern).ptr);
    break;
  case 0x1a6:
    if (((scriptContext->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar2 = UnifiedRegex::RegexPattern::IsUnicode((this->pattern).ptr);
    break;
  case 0x1a7:
    if (((scriptContext->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar2 = UnifiedRegex::RegexPattern::IsSticky((this->pattern).ptr);
    break;
  default:
    if (propertyId == 0x153) {
      if (((scriptContext->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
        return false;
      }
      pJVar3 = ToString(this,true);
    }
    else {
      if (propertyId != 0x1e0) {
        return false;
      }
      if (((scriptContext->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
        return false;
      }
      pJVar3 = (JavascriptString *)GetOptions(this);
    }
    goto LAB_00bb315d;
  }
  pJVar3 = (JavascriptString *)JavascriptLibrary::CreateBoolean(this_00,(uint)bVar2);
LAB_00bb315d:
  *value = pJVar3;
  *result = 1;
  bVar2 = true;
switchD_00bb2fdf_caseD_1a1:
  return bVar2;
}

Assistant:

bool JavascriptRegExp::GetPropertyBuiltIns(PropertyId propertyId, Var* value, BOOL* result)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define GET_FLAG(patternMethod) \
        if (!scriptConfig->IsES6RegExPrototypePropertiesEnabled()) \
        { \
            *value = this->GetLibrary()->CreateBoolean(this->GetPattern()->##patternMethod##()); \
            *result = true; \
            return true; \
        } \
        else \
        { \
            return false; \
        }

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            if (this->lastIndexVar == nullptr)
            {
                Assert(lastIndexOrFlag <= MaxCharCount);
                this->lastIndexVar = JavascriptNumber::ToVar(lastIndexOrFlag, GetScriptContext());
            }
            *value = this->lastIndexVar;
            *result = true;
            return true;
        case PropertyIds::global:
            GET_FLAG(IsGlobal)
        case PropertyIds::multiline:
            GET_FLAG(IsMultiline)
        case PropertyIds::dotAll:
            GET_FLAG(IsDotAll)
        case PropertyIds::ignoreCase:
            GET_FLAG(IsIgnoreCase)
        case PropertyIds::unicode:
            GET_FLAG(IsUnicode)
        case PropertyIds::sticky:
            GET_FLAG(IsSticky)
        case PropertyIds::source:
            if (!scriptConfig->IsES6RegExPrototypePropertiesEnabled())
            {
                *value = this->ToString(true);
                *result = true;
                return true;
            }
            else
            {
                return false;
            }
        case PropertyIds::options:
            if (!scriptConfig->IsES6RegExPrototypePropertiesEnabled())
            {
                *value = GetOptions();
                *result = true;
                return true;
            }
            else
            {
                return false;
            }
        default:
            return false;
        }

#undef GET_FLAG
    }